

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O1

void __thiscall FGameConfigFile::DoAutoloadSetup(FGameConfigFile *this,FIWadManager *iwad_man)

{
  FIWADInfo *pFVar1;
  bool bVar2;
  char *__nptr;
  FIWADInfo *pFVar3;
  long newlen;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  FString section;
  FString workname;
  FString local_40;
  FString local_38;
  
  bVar2 = FConfigFile::SetSection(&this->super_FConfigFile,"LastRun",false);
  if (((!bVar2) ||
      (__nptr = FConfigFile::GetValueForKey(&this->super_FConfigFile,"Version"),
      __nptr == (char *)0x0)) || (dVar6 = atof(__nptr), dVar6 < 211.0)) {
    FConfigFile::RenameSection(&this->super_FConfigFile,"Chex3.Autoload","chex.chex3.Autoload");
    FConfigFile::RenameSection(&this->super_FConfigFile,"Chex1.Autoload","chex.chex1.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"HexenDK.Autoload","hexen.deathkings.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"HereticSR.Autoload","heretic.shadow.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"FreeDM.Autoload","doom.freedoom.freedm.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Freedoom2.Autoload","doom.freedoom.phase2.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Freedoom1.Autoload","doom.freedoom.phase1.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Freedoom.Autoload","doom.freedoom.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"DoomBFG.Autoload","doom.doom1.bfg.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"DoomU.Autoload","doom.doom1.ultimate.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Doom1.Autoload","doom.doom1.registered.Autoload");
    FConfigFile::RenameSection(&this->super_FConfigFile,"TNT.Autoload","doom.doom2.tnt.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Plutonia.Autoload","doom.doom2.plutonia.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Doom2BFG.Autoload","doom.doom2.bfg.Autoload");
    FConfigFile::RenameSection
              (&this->super_FConfigFile,"Doom2.Autoload","doom.doom2.commercial.Autoload");
  }
  if ((iwad_man->mIWads).Count != 0) {
    pFVar3 = (iwad_man->mIWads).Array;
    uVar4 = 0;
    pFVar1 = pFVar3;
    do {
      if ((pFVar3[uVar4].flags & 2) == 0) {
        FString::AttachToOther(&local_38,&pFVar1->Autoname);
        do {
          if (*(int *)(local_38.Chars + -0xc) == 0) break;
          FString::operator+(&local_40,(char *)&local_38);
          FConfigFile::CreateSectionAtStart(&this->super_FConfigFile,local_40.Chars);
          newlen = FString::LastIndexOf(&local_38,'.');
          if (newlen < 0) {
            FString::~FString(&local_40);
            break;
          }
          FString::Truncate(&local_38,newlen);
          FString::~FString(&local_40);
        } while (-1 < newlen);
        FString::~FString(&local_38);
      }
      uVar5 = uVar4 + 1;
      pFVar3 = (iwad_man->mIWads).Array;
      pFVar1 = pFVar3 + uVar4 + 1;
      uVar4 = uVar5;
    } while (uVar5 < (iwad_man->mIWads).Count);
  }
  FConfigFile::CreateSectionAtStart(&this->super_FConfigFile,"Global.Autoload");
  CreateStandardAutoExec(this,"Chex.AutoExec",true);
  CreateStandardAutoExec(this,"Strife.AutoExec",true);
  CreateStandardAutoExec(this,"Hexen.AutoExec",true);
  CreateStandardAutoExec(this,"Heretic.AutoExec",true);
  CreateStandardAutoExec(this,"Doom.AutoExec",true);
  FConfigFile::MoveSectionToStart(&this->super_FConfigFile,"FileSearch.Directories");
  FConfigFile::MoveSectionToStart(&this->super_FConfigFile,"IWADSearch.Directories");
  FConfigFile::SetSectionNote
            (&this->super_FConfigFile,"Doom.AutoExec",
             "# Files to automatically execute when running the corresponding game.\n# Each file should be on its own line, preceded by Path=\n\n"
            );
  FConfigFile::SetSectionNote
            (&this->super_FConfigFile,"Global.Autoload",
             "# WAD files to always load. These are loaded after the IWAD but before\n# any files added with -file. Place each file on its own line, preceded\n# by Path=\n"
            );
  FConfigFile::SetSectionNote
            (&this->super_FConfigFile,"Doom.Autoload",
             "# Wad files to automatically load depending on the game and IWAD you are\n# playing.  You may have have files that are loaded for all similar IWADs\n# (the game) and files that are only loaded for particular IWADs. For example,\n# any files listed under \'doom.Autoload\' will be loaded for any version of Doom,\n# but files listed under \'doom.doom2.Autoload\' will only load when you are\n# playing a Doom 2 based game (doom2.wad, tnt.wad or plutonia.wad), and files listed under\n# \'doom.doom2.commercial.Autoload\' only when playing doom2.wad.\n\n"
            );
  return;
}

Assistant:

void FGameConfigFile::DoAutoloadSetup (FIWadManager *iwad_man)
{
	// Create auto-load sections, so users know what's available.
	// Note that this totem pole is the reverse of the order that
	// they will appear in the file.

	double last = 0;
	if (SetSection ("LastRun"))
	{
		const char *lastver = GetValueForKey ("Version");
		if (lastver != NULL) last = atof(lastver);
	}

	if (last < 211)
	{
		RenameSection("Chex3.Autoload", "chex.chex3.Autoload");
		RenameSection("Chex1.Autoload", "chex.chex1.Autoload");
		RenameSection("HexenDK.Autoload", "hexen.deathkings.Autoload");
		RenameSection("HereticSR.Autoload", "heretic.shadow.Autoload");
		RenameSection("FreeDM.Autoload", "doom.freedoom.freedm.Autoload");
		RenameSection("Freedoom2.Autoload", "doom.freedoom.phase2.Autoload");
		RenameSection("Freedoom1.Autoload", "doom.freedoom.phase1.Autoload");
		RenameSection("Freedoom.Autoload", "doom.freedoom.Autoload");
		RenameSection("DoomBFG.Autoload", "doom.doom1.bfg.Autoload");
		RenameSection("DoomU.Autoload", "doom.doom1.ultimate.Autoload");
		RenameSection("Doom1.Autoload", "doom.doom1.registered.Autoload");
		RenameSection("TNT.Autoload", "doom.doom2.tnt.Autoload");
		RenameSection("Plutonia.Autoload", "doom.doom2.plutonia.Autoload");
		RenameSection("Doom2BFG.Autoload", "doom.doom2.bfg.Autoload");
		RenameSection("Doom2.Autoload", "doom.doom2.commercial.Autoload");
	}
	const FString *pAuto;
	for (int num = 0; (pAuto = iwad_man->GetAutoname(num)) != NULL; num++)
	{
		if (!(iwad_man->GetIWadFlags(num) & GI_SHAREWARE))	// we do not want autoload sections for shareware IWADs (which may have an autoname for resource filtering)
		{
			FString workname = *pAuto;

			while (workname.IsNotEmpty())
			{
				FString section = workname + ".Autoload";
				CreateSectionAtStart(section.GetChars());
				long dotpos = workname.LastIndexOf('.');
				if (dotpos < 0) break;
				workname.Truncate(dotpos);
			}
		}
	}
	CreateSectionAtStart("Global.Autoload");

	// The same goes for auto-exec files.
	CreateStandardAutoExec("Chex.AutoExec", true);
	CreateStandardAutoExec("Strife.AutoExec", true);
	CreateStandardAutoExec("Hexen.AutoExec", true);
	CreateStandardAutoExec("Heretic.AutoExec", true);
	CreateStandardAutoExec("Doom.AutoExec", true);

	// Move search paths back to the top.
	MoveSectionToStart("FileSearch.Directories");
	MoveSectionToStart("IWADSearch.Directories");

	SetSectionNote("Doom.AutoExec",
		"# Files to automatically execute when running the corresponding game.\n"
		"# Each file should be on its own line, preceded by Path=\n\n");
	SetSectionNote("Global.Autoload",
		"# WAD files to always load. These are loaded after the IWAD but before\n"
		"# any files added with -file. Place each file on its own line, preceded\n"
		"# by Path=\n");
	SetSectionNote("Doom.Autoload",
		"# Wad files to automatically load depending on the game and IWAD you are\n"
		"# playing.  You may have have files that are loaded for all similar IWADs\n"
		"# (the game) and files that are only loaded for particular IWADs. For example,\n"
		"# any files listed under 'doom.Autoload' will be loaded for any version of Doom,\n"
		"# but files listed under 'doom.doom2.Autoload' will only load when you are\n"
		"# playing a Doom 2 based game (doom2.wad, tnt.wad or plutonia.wad), and files listed under\n"
		"# 'doom.doom2.commercial.Autoload' only when playing doom2.wad.\n\n");
}